

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

VertexProcess ON_SubDToBrepParameters::VertexProcessFromUnsigned(uint vertex_process_as_unsigned)

{
  if (vertex_process_as_unsigned < 5) {
    return (VertexProcess)vertex_process_as_unsigned;
  }
  ON_SubDIncrementErrorCount();
  return None;
}

Assistant:

ON_SubDToBrepParameters::VertexProcess ON_SubDToBrepParameters::VertexProcessFromUnsigned(
  unsigned int vertex_process_as_unsigned
)
{
  switch (vertex_process_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDToBrepParameters::VertexProcess::None);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDToBrepParameters::VertexProcess::LocalG1);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDToBrepParameters::VertexProcess::LocalG2);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDToBrepParameters::VertexProcess::LocalG1x);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDToBrepParameters::VertexProcess::LocalG1xx);
  }
  return ON_SUBD_RETURN_ERROR(ON_SubDToBrepParameters::VertexProcess::None);
}